

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

char * bloaty::GetDataSourceLabel(DataSource source)

{
  long lVar1;
  long lVar2;
  
  lVar1 = -0x10;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x18 == 0xf8) {
      fprintf(_stderr,"Unknown data source label: %d\n");
      exit(1);
    }
    lVar1 = lVar2 + 0x18;
  } while (*(DataSource *)((long)&PTR_anon_var_dwarf_5a053_005fa100 + lVar2) != source);
  return *(char **)((long)&DAT_005fa108 + lVar2);
}

Assistant:

const char* GetDataSourceLabel(DataSource source) {
  for (size_t i = 0; i < ARRAY_SIZE(data_sources); i++) {
    if (data_sources[i].number == source) {
      return data_sources[i].name;
    }
  }
  fprintf(stderr, "Unknown data source label: %d\n", static_cast<int>(source));
  exit(1);
  return nullptr;
}